

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

StorageClass __thiscall spv::Builder::getStorageClass(Builder *this,Id resultId)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = ppIVar1[ppIVar1[resultId]->typeId];
  if (pIVar2->opCode == OpTypePointer) {
    return *(pIVar2->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  }
  __assert_fail("idToInstruction[typeId]->getOpCode() == spv::OpTypePointer",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/spvIR.h"
                ,0x161,"StorageClass spv::Module::getStorageClass(Id) const");
}

Assistant:

StorageClass getStorageClass(Id typeId) const
    {
        assert(idToInstruction[typeId]->getOpCode() == spv::OpTypePointer);
        return (StorageClass)idToInstruction[typeId]->getImmediateOperand(0);
    }